

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::TryGenerateFastCmSrXx(Lowerer *this,Instr *instr)

{
  bool bVar1;
  RegOpnd *opnd;
  RegOpnd *opnd_00;
  Lowerer *this_00;
  
  bVar1 = IR::Opnd::IsRegOpnd(instr->m_src1);
  if (bVar1) {
    opnd = IR::Opnd::AsRegOpnd(instr->m_src1);
  }
  else {
    opnd = (RegOpnd *)0x0;
  }
  this_00 = (Lowerer *)instr->m_src2;
  bVar1 = IR::Opnd::IsRegOpnd((Opnd *)this_00);
  if (bVar1) {
    this_00 = (Lowerer *)instr->m_src2;
    opnd_00 = IR::Opnd::AsRegOpnd((Opnd *)this_00);
    if (opnd_00 != (RegOpnd *)0x0) {
      bVar1 = IsConstRegOpnd(this_00,opnd_00);
      if (bVar1) goto LAB_0056339c;
    }
  }
  if (opnd != (RegOpnd *)0x0) {
    bVar1 = IsConstRegOpnd(this_00,opnd);
    if (bVar1) {
      IR::Instr::SwapOpnds(instr);
LAB_0056339c:
      bVar1 = LowererMD::GenerateFastCmSrXxConst(&this->m_lowererMD,instr);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool
Lowerer::TryGenerateFastCmSrXx(IR::Instr * instr)
{
    IR::RegOpnd *srcReg1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *srcReg2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;

    if (srcReg2 && IsConstRegOpnd(srcReg2))
    {
        return m_lowererMD.GenerateFastCmSrXxConst(instr);
    }
    else if (srcReg1 && IsConstRegOpnd(srcReg1))
    {
        instr->SwapOpnds();
        return m_lowererMD.GenerateFastCmSrXxConst(instr);
    }

    return false;
}